

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O1

int __thiscall Fl_Input_Type::textstuff(Fl_Input_Type *this,int w,Fl_Font *f,int *s,Fl_Color *c)

{
  Fl_Type *pFVar1;
  
  if (w == 4) {
    this = (Fl_Input_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.factory;
  }
  if ((uint)w < 5) {
    pFVar1 = ((Fl_Type *)((long)this + 0x78))->prev;
    switch(w) {
    default:
      *f = *(Fl_Font *)((long)&pFVar1[1].parent + 4);
      *s = *(int *)&pFVar1[1].new_selected;
      *c = *(Fl_Color *)&pFVar1[1].rtti;
      break;
    case 1:
      *(Fl_Font *)((long)&pFVar1[1].parent + 4) = *f;
      break;
    case 2:
      *(int *)&pFVar1[1].new_selected = *s;
      break;
    case 3:
      *(Fl_Color *)&pFVar1[1].rtti = *c;
    }
  }
  return 1;
}

Assistant:

int Fl_Input_Type::textstuff(int w, Fl_Font& f, int& s, Fl_Color& c) {
  Fl_Input_ *myo = (Fl_Input_*)(w==4 ? ((Fl_Widget_Type*)factory)->o : o);
  switch (w) {
    case 4:
    case 0: f = myo->textfont(); s = myo->textsize(); c = myo->textcolor(); break;
    case 1: myo->textfont(f); break;
    case 2: myo->textsize(s); break;
    case 3: myo->textcolor(c); break;
  }
  return 1;
}